

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineReader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::InlineReader::PerformGets(InlineReader *this)

{
  int iVar1;
  ostream *poVar2;
  ScopedTimer __var2110;
  ScopedTimer local_10;
  
  if (PerformGets()::__var110 == '\0') {
    iVar1 = __cxa_guard_acquire(&PerformGets()::__var110);
    if (iVar1 != 0) {
      PerformGets::__var110 = (void *)ps_timer_create_("InlineReader::PerformGets");
      __cxa_guard_release(&PerformGets()::__var110);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&local_10,PerformGets::__var110);
  if (this->m_Verbosity == 5) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Inline Reader ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ReaderRank);
    std::operator<<(poVar2,"     PerformGets()\n");
  }
  SetDeferredVariablePointers(this);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_10);
  return;
}

Assistant:

void InlineReader::PerformGets()
{
    PERFSTUBS_SCOPED_TIMER("InlineReader::PerformGets");
    if (m_Verbosity == 5)
    {
        std::cout << "Inline Reader " << m_ReaderRank << "     PerformGets()\n";
    }
    SetDeferredVariablePointers();
}